

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::option_has_no_value_exception::option_has_no_value_exception
          (option_has_no_value_exception *this,string *option)

{
  size_type sVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *local_a0;
  size_type local_98;
  size_type local_90;
  undefined8 uStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar1 = option->_M_string_length;
  if (sVar1 == 0) {
    local_a0 = &local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Option has no value","");
  }
  else {
    std::operator+(&local_40,"Option ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::LQUOTE_abi_cxx11_);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_40,(option->_M_dataplus)._M_p,option->_M_string_length);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if (paVar5 == paVar4) {
      local_80.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    }
    else {
      local_80.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_80._M_dataplus._M_p = (pointer)paVar5;
    }
    local_80._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_80,(anonymous_namespace)::RQUOTE_abi_cxx11_,DAT_001306e8);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if (paVar5 == paVar4) {
      local_60.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_60.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    }
    else {
      local_60.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_60._M_dataplus._M_p = (pointer)paVar5;
    }
    local_60._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_60," has no value");
    local_a0 = &local_90;
    psVar2 = (size_type *)(pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2 == paVar5) {
      local_90 = paVar5->_M_allocated_capacity;
      uStack_88 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    }
    else {
      local_90 = paVar5->_M_allocated_capacity;
      local_a0 = psVar2;
    }
    local_98 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
  }
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_0012f580;
  paVar5 = &(this->super_OptionException).m_message.field_2;
  (this->super_OptionException).m_message._M_dataplus._M_p = (pointer)paVar5;
  if (local_a0 == &local_90) {
    paVar5->_M_allocated_capacity = local_90;
    *(undefined8 *)((long)&(this->super_OptionException).m_message.field_2 + 8) = uStack_88;
  }
  else {
    (this->super_OptionException).m_message._M_dataplus._M_p = (pointer)local_a0;
    (this->super_OptionException).m_message.field_2._M_allocated_capacity = local_90;
  }
  (this->super_OptionException).m_message._M_string_length = local_98;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  if (sVar1 != 0) {
    local_a0 = &local_90;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_0012fd38;
  return;
}

Assistant:

explicit option_has_no_value_exception(const std::string& option)
    : OptionException(
        !option.empty() ?
        ("Option " + LQUOTE + option + RQUOTE + " has no value") :
        "Option has no value")
    {
    }